

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O0

void __thiscall QGraphicsViewPrivate::centerView(QGraphicsViewPrivate *this,ViewportAnchor anchor)

{
  long lVar1;
  bool bVar2;
  QWidget *this_00;
  int in_ESI;
  QGraphicsViewPrivate *in_RDI;
  long in_FS_OFFSET;
  QPointF QVar3;
  QGraphicsView *q;
  QPointF transformationDiff;
  QRect *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff40;
  QGraphicsViewPrivate *this_01;
  undefined1 in_stack_ffffffffffffff50 [16];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  this_00 = (QWidget *)q_func(in_RDI);
  if (in_ESI != 0) {
    if (in_ESI == 1) {
      QGraphicsView::centerOn(in_stack_ffffffffffffff50._8_8_,in_stack_ffffffffffffff50._0_8_);
    }
    else if (in_ESI == 2) {
      bVar2 = QWidget::underMouse((QWidget *)0xa323f3);
      if (bVar2) {
        QWidget::rect(this_00);
        QRect::toRectF(in_stack_ffffffffffffff20);
        QRectF::center((QRectF *)in_RDI);
        mapToScene(this_01,(QPointF *)CONCAT44(in_ESI,in_stack_ffffffffffffff40));
        QCursor::pos();
        QPoint::toPointF((QPoint *)in_RDI);
        QWidget::mapFromGlobal
                  ((QWidget *)CONCAT44(in_ESI,in_stack_ffffffffffffff40),(QPointF *)this_00);
        mapToScene(this_01,(QPointF *)CONCAT44(in_ESI,in_stack_ffffffffffffff40));
        ::operator-((QPointF *)in_RDI,(QPointF *)in_stack_ffffffffffffff20);
        QVar3 = ::operator+((QPointF *)in_RDI,(QPointF *)this_00);
        QGraphicsView::centerOn((QGraphicsView *)QVar3.yp,(QPointF *)QVar3.xp);
      }
      else {
        QGraphicsView::centerOn(in_stack_ffffffffffffff50._8_8_,in_stack_ffffffffffffff50._0_8_);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsViewPrivate::centerView(QGraphicsView::ViewportAnchor anchor)
{
    Q_Q(QGraphicsView);
    switch (anchor) {
    case QGraphicsView::AnchorUnderMouse: {
        if (q->underMouse()) {
            // Last scene pos: lastMouseMoveScenePoint
            // Current mouse pos:
            QPointF transformationDiff = mapToScene(viewport->rect().toRectF().center())
                                         - mapToScene(viewport->mapFromGlobal(QCursor::pos().toPointF()));
            q->centerOn(lastMouseMoveScenePoint + transformationDiff);
        } else {
            q->centerOn(lastCenterPoint);
        }
        break;
    }
    case QGraphicsView::AnchorViewCenter:
        q->centerOn(lastCenterPoint);
        break;
    case QGraphicsView::NoAnchor:
        break;
    }
}